

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,undefined8 *xn,xpath_allocator *alloc)

{
  xml_node_struct *n;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  char_t *string;
  xpath_node xStack_38;
  
  n = (xml_node_struct *)*xn;
  pxVar1 = (xml_attribute_struct *)xn[1];
  if (n != (xml_node_struct *)0x0 && pxVar1 == (xml_attribute_struct *)0x0) {
    step_push(this,ns,n,alloc);
    return;
  }
  if (((pxVar1 == (xml_attribute_struct *)0x0) || (n == (xml_node_struct *)0x0)) ||
     (this->_test != '\x02')) {
    return;
  }
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2644,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_attribute_struct *, xml_node_struct *, xpath_allocator *)"
                 );
  }
  string = "";
  if (pxVar1->name != (char_t *)0x0) {
    string = pxVar1->name;
  }
  switch(this->_test) {
  case '\x01':
    bVar2 = strequal(string,(this->_data).string);
    break;
  case '\x02':
  case '\a':
    goto switchD_00113403_caseD_2;
  default:
    goto switchD_00113403_caseD_3;
  case '\b':
    bVar2 = starts_with(string,(this->_data).string);
  }
  if (bVar2 != false) {
switchD_00113403_caseD_2:
    bVar2 = is_xpath_attribute(string);
    if (bVar2) {
      xStack_38._node._root = n;
      xStack_38._attribute._attr = pxVar1;
      xpath_node_set_raw::push_back(ns,&xStack_38,alloc);
    }
  }
switchD_00113403_caseD_3:
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}